

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> __thiscall
punky::par::Parser::parse_block_statement(Parser *this)

{
  TokenType TVar1;
  Parser *in_RSI;
  Token blk_tok;
  _Alloc_hider local_70;
  BlockStmt *local_68;
  undefined1 local_60 [16];
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  tok::Token::Token((Token *)(local_60 + 8),&in_RSI->m_curr_tok);
  std::make_unique<punky::ast::BlockStmt,punky::tok::Token&>((Token *)&local_68);
  consume(in_RSI);
  do {
    TVar1 = (in_RSI->m_curr_tok).m_type;
    if (TVar1 == RightBrace) {
      (this->m_lex).m_line._M_dataplus._M_p = (pointer)local_68;
LAB_0010a170:
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_50);
      return (__uniq_ptr_data<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>,_true,_true>
              )(__uniq_ptr_data<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>,_true,_true>
                )this;
    }
    if (TVar1 == EOS) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[36]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &in_RSI->m_errors,(char (*) [36])"Block statement missing closing \'}\'");
      (this->m_lex).m_line._M_dataplus._M_p = (pointer)0x0;
      if (local_68 != (BlockStmt *)0x0) {
        (*(local_68->super_StmtNode).super_AstNode._vptr_AstNode[1])();
      }
      goto LAB_0010a170;
    }
    parse_statement((Parser *)local_60);
    if ((pointer)local_60._0_8_ != (pointer)0x0) {
      local_70._M_p = (pointer)local_60._0_8_;
      ast::BlockStmt::push_stmt
                (local_68,(unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>
                           *)&local_70);
      if ((long *)local_70._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_70._M_p + 8))();
      }
      local_70._M_p = (pointer)0x0;
    }
    consume(in_RSI);
  } while( true );
}

Assistant:

auto Parser::parse_block_statement() -> std::unique_ptr<ast::BlockStmt>
{
    auto blk_tok = m_curr_tok;
    auto blk     = std::make_unique<ast::BlockStmt>(blk_tok);
    consume();
    while (!curr_type_is(TokenType::RightBrace))
    {
        if (curr_type_is(TokenType::EOS))
        {
            m_errors.emplace_back("Block statement missing closing '}'");
            return nullptr;
        }
        auto stmt = parse_statement();
        if (stmt)
            blk->push_stmt(std::move(stmt));
        consume();
    }
    return blk;
}